

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_image *
rf_image_resize_nn_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,int new_width,int new_height,void *dst,
          rf_int dst_size)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  void *dst_00;
  long in_FS_OFFSET;
  void *local_b8;
  long local_b0;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if (image.valid == true) {
    uVar3 = 0;
    if (image.format - RF_UNCOMPRESSED_GRAYSCALE < 10) {
      uVar3 = *(uint *)(&DAT_0017c058 + (ulong)(image.format - RF_UNCOMPRESSED_GRAYSCALE) * 4);
    }
    if (dst_size < (int)(new_height * new_width * uVar3)) {
      rf_log_impl(8,0x17cde5,(char *)0x4);
      *(char **)(in_FS_OFFSET + -0x450) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(in_FS_OFFSET + -0x448) = "rf_image_resize_nn_to_buffer";
      *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3e62;
      *(undefined4 *)(in_FS_OFFSET + -0x438) = 4;
    }
    else {
      if (0 < new_height) {
        local_b0 = 0;
        local_b8 = dst;
        do {
          if (0 < new_width) {
            lVar1 = 0;
            lVar2 = (long)new_width;
            dst_00 = local_b8;
            do {
              rf_format_one_pixel((void *)((long)(int)(((int)((ulong)lVar1 >> 0x10) +
                                                       (int)((ulong)(local_b0 *
                                                                    ((image.height << 0x10) /
                                                                     new_height + 1)) >> 0x10) *
                                                       image.width) * uVar3) + (long)image.data),
                                  image.format,dst_00,image.format);
              dst_00 = (void *)((long)dst_00 + (ulong)uVar3);
              lVar1 = lVar1 + ((image.width << 0x10) / new_width + 1);
              lVar2 = lVar2 + -1;
            } while (lVar2 != 0);
          }
          local_b0 = local_b0 + 1;
          local_b8 = (void *)((long)local_b8 + (long)new_width * (ulong)uVar3);
        } while (local_b0 != new_height);
      }
      __return_storage_ptr__->data = dst;
      __return_storage_ptr__->width = new_width;
      __return_storage_ptr__->height = new_height;
      __return_storage_ptr__->format = image.format;
      __return_storage_ptr__->valid = true;
    }
  }
  else {
    rf_log_impl(8,0x17cd7e,(char *)0x1);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_image_resize_nn_to_buffer";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3e64;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 1;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_resize_nn_to_buffer(rf_image image, int new_width, int new_height, void* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (image.valid)
    {
        int bpp = rf_bytes_per_pixel(image.format);
        int expected_size = new_width * new_height * bpp;

        if (dst_size >= expected_size)
        {
            // EDIT: added +1 to account for an early rounding problem
            int x_ratio = (int)((image.width  << 16) / new_width ) + 1;
            int y_ratio = (int)((image.height << 16) / new_height) + 1;

            unsigned char* src = image.data;

            int x2, y2;
            for (rf_int y = 0; y < new_height; y++)
            {
                for (rf_int x = 0; x < new_width; x++)
                {
                    x2 = ((x * x_ratio) >> 16);
                    y2 = ((y * y_ratio) >> 16);

                    rf_format_one_pixel(src + ((y2 * image.width) + x2) * bpp, image.format,
                                        ((unsigned char *) dst) + ((y * new_width) + x) * bpp, image.format);
                }
            }

            result.data   = dst;
            result.width  = new_width;
            result.height = new_height;
            result.format = image.format;
            result.valid  = true;
        }
        else RF_LOG_ERROR(RF_BAD_BUFFER_SIZE, "Expected `dst` to be at least %d bytes but was %d bytes", expected_size, dst_size);
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Image is invalid.");

    return result;
}